

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O1

void unodb::detail::dump_key<unsigned_long>(ostream *os,unsigned_long key)

{
  long lVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"key: 0x",7);
  lVar1 = *(long *)os;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = os + lVar1;
  if (os[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar3;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

[[gnu::cold]] void dump_key(std::ostream &os, T key) {
  if constexpr (std::is_same_v<T, key_view>) {
    const auto sz = key.size_bytes();
    os << "key(" << sz << "): 0x";
    for (std::size_t i = 0; i < sz; ++i) unodb::detail::dump_byte(os, key[i]);
  } else {
    os << "key: 0x" << std::hex << std::setfill('0') << std::setw(sizeof(key))
       << key << std::dec;
  }
}